

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O0

u16 u16Shuffle(u16 w)

{
  ushort uVar1;
  ushort uVar2;
  u16 t;
  u16 w_local;
  
  uVar1 = (w ^ (ushort)((int)(uint)w >> 4)) & 0xf0;
  uVar2 = w ^ uVar1 ^ uVar1 << 4;
  uVar1 = (uVar2 ^ (ushort)((int)(uint)uVar2 >> 2)) & 0xc0c;
  uVar2 = uVar2 ^ uVar1 ^ uVar1 << 2;
  uVar1 = (uVar2 ^ (ushort)((int)(uint)uVar2 >> 1)) & 0x2222;
  return uVar2 ^ uVar1 ^ uVar1 << 1;
}

Assistant:

u16 u16Shuffle(register u16 w)
{
	register u16 t;
	t = (w ^ (w >> 4)) & 0x00F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 2)) & 0x0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 1)) & 0x2222, w ^= t ^ (t << 1);
	t = 0;
	return w;
}